

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O1

void __thiscall
gl4cts::ShaderSubroutine::APITest2::verifyGLGetActiveSubroutineNameFunctionality(APITest2 *this)

{
  ostringstream *poVar1;
  char *__s1;
  int iVar2;
  deUint32 dVar3;
  size_t sVar4;
  undefined4 extraout_var;
  GLchar *__s;
  MessageBuilder *pMVar6;
  TestError *this_00;
  ulong __n;
  int iVar7;
  GLsizei reported_length;
  int local_1b4;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  sVar4 = strlen(this->m_subroutine_name1);
  iVar7 = (int)sVar4 + 1;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_1b4 = 0;
  (**(code **)(lVar5 + 0x738))(this->m_po_id,0x8b31,0,0,0,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7de);
  (**(code **)(lVar5 + 0x990))(this->m_po_id,0x92e8,0x92f6,&local_1b4);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7e1);
  iVar2 = local_1b4;
  __n = (ulong)local_1b4;
  if (local_1b4 != iVar7) {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Invalid active subroutine name length reported:",0x2f);
    std::ostream::operator<<(poVar1,local_1b4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", instead of: ",0xe);
    std::ostream::operator<<(poVar1,iVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," or ",4);
    std::ostream::operator<<(poVar1,iVar7);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_138);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Incorrect length of active subroutine name",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
               ,0x7ea);
LAB_009822c8:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  __s = (GLchar *)operator_new__(__n);
  this->m_buffer = __s;
  memset(__s,0,__n);
  (**(code **)(lVar5 + 0x738))(this->m_po_id,0x8b31,0,iVar2,0,__s);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetActiveSubroutineName() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x7f3);
  __s1 = this->m_buffer;
  iVar2 = strcmp(__s1,this->m_subroutine_name1);
  if (iVar2 != 0) {
    iVar2 = strcmp(__s1,this->m_subroutine_name2);
    if (iVar2 != 0) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Invalid active subroutine name reported:[",0x29);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_buffer);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,
                 "] instead of:[",0xe);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_subroutine_name1);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"] or:[",6);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_subroutine_name2);
      std::__ostream_insert<char,std::char_traits<char>>
                (&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"].",2);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_138);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid active subroutine name reported.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                 ,0x7fe);
      goto LAB_009822c8;
    }
  }
  if (__s1 != (char *)0x0) {
    operator_delete__(__s1);
  }
  this->m_buffer = (GLchar *)0x0;
  return;
}

Assistant:

void APITest2::verifyGLGetActiveSubroutineNameFunctionality()
{
	GLsizei				  expected_length1 = (GLsizei)strlen(m_subroutine_name1) + 1;
	GLsizei				  expected_length2 = (GLsizei)strlen(m_subroutine_name1) + 1;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	GLsizei				  reported_length  = 0;

	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, 0, /* index */
							   0,							 /* bufsize */
							   DE_NULL,						 /* length */
							   DE_NULL);					 /* name */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	gl.getProgramInterfaceiv(m_po_id, GL_VERTEX_SUBROUTINE, GL_MAX_NAME_LENGTH, &reported_length);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	if ((reported_length != expected_length1) && (reported_length != expected_length2))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Invalid active subroutine name length reported:" << reported_length
						   << ", instead of: " << expected_length1 << " or " << expected_length2
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("Incorrect length of active subroutine name");
	}

	m_buffer = new glw::GLchar[reported_length];

	memset(m_buffer, 0, reported_length);

	gl.getActiveSubroutineName(m_po_id, GL_VERTEX_SHADER, 0, reported_length, DE_NULL, /* length */
							   m_buffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetActiveSubroutineName() call failed.");

	if (strcmp(m_buffer, m_subroutine_name1) != 0 && strcmp(m_buffer, m_subroutine_name2) != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Invalid active subroutine name reported:[" << m_buffer
						   << "]"
							  " instead of:["
						   << m_subroutine_name1 << "]"
													" or:["
						   << m_subroutine_name2 << "]." << tcu::TestLog::EndMessage;

		TCU_FAIL("Invalid active subroutine name reported.");
	}

	delete[] m_buffer;
	m_buffer = DE_NULL;
}